

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O0

void __thiscall
ylt::metric::dynamic_metric_manager<remove_tag>::remove_metric_by_label
          (dynamic_metric_manager<remove_tag> *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *labels)

{
  anon_class_8_1_5ef4513d *in_stack_00000030;
  map_sharded_t<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>_>_>_>,_ylt::metric::dynamic_metric_manager<remove_tag>::my_hash<131UL>_>
  *in_stack_00000038;
  
  util::
  map_sharded_t<std::unordered_map<std::__cxx11::string,std::shared_ptr<ylt::metric::dynamic_metric>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<ylt::metric::dynamic_metric>>>>,ylt::metric::dynamic_metric_manager<remove_tag>::my_hash<131ul>>
  ::
  erase_if<ylt::metric::dynamic_metric_manager<remove_tag>::remove_metric_by_label(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::_lambda(auto:1&)_1_>
            (in_stack_00000038,in_stack_00000030);
  return;
}

Assistant:

void remove_metric_by_label(
      const std::map<std::string, std::string>& labels) {
    metric_map_.erase_if([&](auto& metric) {
      auto&& [_, m] = metric;
      const auto& labels_name = m->labels_name();
      if (labels.size() > labels_name.size()) {
        return false;
      }

      if (labels.size() == labels_name.size()) {
        std::vector<std::string> label_value;
        for (auto& lb_name : labels_name) {
          if (auto i = labels.find(lb_name); i != labels.end()) {
            label_value.push_back(i->second);
          }
        }
        return m->has_label_value(label_value);
      }
      else {
        for (auto& label : labels) {
          if (auto i = std::find(labels_name.begin(), labels_name.end(),
                                 label.first);
              i != labels_name.end()) {
            if (!m->has_label_value(label.second)) {
              return false;
            }
          }
          else {
            return false;
          }
        }
        return true;
      }
    });
  }